

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclBufSize.c
# Opt level: O2

void Bus_SclCheckSortedFanout(Vec_Ptr_t *vFanouts)

{
  int iVar1;
  uint uVar2;
  uint i;
  Abc_Obj_t *pNext;
  Abc_Obj_t *pObj;
  
  i = 0xffffffff;
  do {
    uVar2 = i;
    i = uVar2 + 1;
    if (vFanouts->nSize + -1 <= (int)i) {
      return;
    }
    pObj = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,i);
    pNext = (Abc_Obj_t *)Vec_PtrEntry(vFanouts,uVar2 + 2);
    iVar1 = Bus_SclCompareFanouts(&pObj,&pNext);
  } while (iVar1 == -1);
  printf("Fanouts %d and %d are out of order.\n",(ulong)i,(ulong)(uVar2 + 2));
  Abc_NtkPrintFanoutProfileVec((Abc_Obj_t *)0x0,vFanouts);
  return;
}

Assistant:

void Bus_SclCheckSortedFanout( Vec_Ptr_t * vFanouts )
{
    Abc_Obj_t * pObj, * pNext;
    int i;
    for ( i = 0; i < Vec_PtrSize(vFanouts) - 1; i++ )
    {
        pObj  = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i);
        pNext = (Abc_Obj_t *)Vec_PtrEntry(vFanouts, i+1);
        if ( Bus_SclCompareFanouts( &pObj, &pNext ) != -1 )
        {
            printf( "Fanouts %d and %d are out of order.\n", i, i+1 );
            Abc_NtkPrintFanoutProfileVec( NULL, vFanouts );
            return;
        }
    }
}